

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::unicodeIntOrRange(GrpParser *this)

{
  undefined1 uVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp151_AST;
  RefAST tmp150_AST;
  RefAST tmp149_AST;
  RefAST tmp148_AST;
  RefAST unicodeIntOrRange_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffed0;
  BitSet *in_stack_fffffffffffffed8;
  RefCount<AST> *other;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  RefCount<AST> *in_stack_fffffffffffffef0;
  RefToken *in_stack_ffffffffffffff00;
  RefAST *root;
  ASTFactory *in_stack_ffffffffffffff08;
  int iVar4;
  ASTFactory *this_00;
  Parser *in_stack_ffffffffffffff10;
  Parser *this_01;
  ASTPair *in_stack_ffffffffffffff18;
  ASTPair *currentAST_00;
  int in_stack_ffffffffffffff20;
  RefToken *in_stack_ffffffffffffff48;
  NoViableAltException *in_stack_ffffffffffffff50;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=
            (in_stack_fffffffffffffef0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  ASTPair::ASTPair((ASTPair *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  RefCount<AST>::RefCount
            ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (RefCount<AST> *)in_stack_fffffffffffffed8);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((iVar2 == 0x1b) &&
     (in_stack_ffffffffffffff20 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
     in_stack_ffffffffffffff20 == 0x20)) {
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (RefCount<AST> *)in_stack_fffffffffffffed8);
    currentAST_00 = (ASTPair *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
    ASTFactory::create(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    iVar4 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    RefCount<AST>::operator=
              (in_stack_fffffffffffffef0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    this_01 = (Parser *)(in_RDI + 6);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (RefCount<AST> *)in_stack_fffffffffffffed8);
    ASTFactory::addASTChild
              ((ASTFactory *)CONCAT44(iVar2,in_stack_ffffffffffffff20),currentAST_00,
               (RefAST *)this_01);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    Parser::match(this_01,iVar4);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (RefCount<AST> *)in_stack_fffffffffffffed8);
    this_00 = (ASTFactory *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
    ASTFactory::create(this_00,in_stack_ffffffffffffff00);
    RefCount<AST>::operator=
              (in_stack_fffffffffffffef0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    root = (RefAST *)(in_RDI + 6);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (RefCount<AST> *)in_stack_fffffffffffffed8);
    ASTFactory::makeASTRoot((ASTFactory *)this_01,(ASTPair *)this_00,root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    Parser::match(this_01,(int)((ulong)this_00 >> 0x20));
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (RefCount<AST> *)in_stack_fffffffffffffed8);
    (**(code **)(*in_RDI + 0x28))(local_88,in_RDI,1);
    ASTFactory::create(this_00,(RefToken *)root);
    iVar4 = (int)((ulong)this_00 >> 0x20);
    RefCount<AST>::operator=
              (in_stack_fffffffffffffef0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<Token>::~RefCount
              ((RefCount<Token> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    in_stack_fffffffffffffef0 = (RefCount<AST> *)(in_RDI + 6);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (RefCount<AST> *)in_stack_fffffffffffffed8);
    ASTFactory::addASTChild
              ((ASTFactory *)CONCAT44(iVar2,in_stack_ffffffffffffff20),currentAST_00,
               (RefAST *)this_01);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    Parser::match(this_01,iVar4);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
LAB_0021733a:
    RefCount<AST>::operator=
              (in_stack_fffffffffffffef0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    RefCount<AST>::operator=
              (in_stack_fffffffffffffef0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    ASTPair::~ASTPair(in_stack_fffffffffffffed0);
    return;
  }
  in_stack_fffffffffffffeec = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (in_stack_fffffffffffffeec == 0x1b) {
    in_stack_fffffffffffffee8 = (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    uVar1 = BitSet::member(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20)
                          );
    if ((bool)uVar1) {
      RefCount<AST>::RefCount
                ((RefCount<AST> *)CONCAT17(uVar1,in_stack_fffffffffffffee0),
                 (RefCount<AST> *)in_stack_fffffffffffffed8);
      other = (RefCount<AST> *)(in_RDI + 6);
      (**(code **)(*in_RDI + 0x28))(local_a8,in_RDI,1);
      ASTFactory::create(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      iVar4 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      RefCount<AST>::operator=
                (in_stack_fffffffffffffef0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)CONCAT17(uVar1,in_stack_fffffffffffffee0));
      in_stack_fffffffffffffed0 = (ASTPair *)(in_RDI + 6);
      RefCount<AST>::RefCount((RefCount<AST> *)CONCAT17(uVar1,in_stack_fffffffffffffee0),other);
      ASTFactory::addASTChild
                ((ASTFactory *)CONCAT44(iVar2,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
                 (RefAST *)in_stack_ffffffffffffff10);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      Parser::match(in_stack_ffffffffffffff10,iVar4);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      goto LAB_0021733a;
    }
  }
  uVar3 = __cxa_allocate_exception(0x40);
  (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff48,in_RDI,1);
  NoViableAltException::NoViableAltException(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::unicodeIntOrRange() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST unicodeIntOrRange_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==LIT_UHEX) && (LA(2)==OP_DOTDOT)) {
			RefAST tmp148_AST = nullAST;
			tmp148_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp148_AST);
			match(LIT_UHEX);
			RefAST tmp149_AST = nullAST;
			tmp149_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp149_AST);
			match(OP_DOTDOT);
			RefAST tmp150_AST = nullAST;
			tmp150_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp150_AST);
			match(LIT_UHEX);
		}
		else if ((LA(1)==LIT_UHEX) && (_tokenSet_35.member(LA(2)))) {
			RefAST tmp151_AST = nullAST;
			tmp151_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp151_AST);
			match(LIT_UHEX);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		unicodeIntOrRange_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_35);
	}
	returnAST = unicodeIntOrRange_AST;
}